

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineEvaluationTest.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  char *pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  double __x;
  Variable x;
  char *local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  Variable local_b8;
  double local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  CosineExpression local_78;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_d8 = (ulong *)0x0;
  local_b8._vptr_Variable = (_func_int **)&PTR_differentiate_00112820;
  local_b8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_b8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_b8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_60,(double *)&local_d8);
  (local_b8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  Kandinsky::cos<Kandinsky::Variable,_nullptr>(&local_78,&local_b8);
  (**(local_78.super_UnaryExpression.m_arg.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  local_a0 = cos(__x);
  (**((local_b8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_40,vsnprintf,0x148,"%f");
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x10f010);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar6;
    local_60 = (long *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_c8 = *puVar7;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar7;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_98,vsnprintf,0x148,"%f",0xbfefae04be85e5d2);
  uVar8 = 0xf;
  if (local_d8 != &local_c8) {
    uVar8 = local_c8;
  }
  if (uVar8 < local_98._M_string_length + local_d0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_d0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0010a55b;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
LAB_0010a55b:
  local_f8 = (char *)&local_e8;
  pcVar1 = (char *)(puVar4 + 2);
  if ((char *)*puVar4 == pcVar1) {
    local_e8 = *(undefined8 *)pcVar1;
    uStack_e0 = puVar4[3];
  }
  else {
    local_e8 = *(undefined8 *)pcVar1;
    local_f8 = (char *)*puVar4;
  }
  lVar2 = puVar4[1];
  *puVar4 = pcVar1;
  puVar4[1] = 0;
  *pcVar1 = '\0';
  if ((local_a0 == -0.9899924966004454) && (!NAN(local_a0))) {
    if (local_f8 != (char *)&local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    local_78.super_UnaryExpression.super_BaseExpression._vptr_BaseExpression =
         (_func_int **)&PTR___cxa_pure_virtual_00112658;
    if (local_78.super_UnaryExpression.m_arg.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super_UnaryExpression.m_arg.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_b8._vptr_Variable = (_func_int **)&PTR_differentiate_00112820;
    if (local_b8.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return 0;
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_f8,lVar2);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(Kandinsky::cos(x).evaluate() == std::cos(3),
            "cos(" + std::to_string(x.evaluate()) + ") != " + std::to_string(std::cos(3)));
    return 0;
}